

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O2

CrispyValue std_input(CrispyValue *value,Vm *vm)

{
  ssize_t sVar1;
  ObjString *object;
  CrispyValue CVar2;
  char *line;
  
  sVar1 = read_line(&line);
  if (sVar1 < 0) {
    vm->err_flag = true;
    object = new_string(vm,"Error while reading line from stdin",0x23);
  }
  else {
    object = new_string(vm,line,sVar1 - 1);
    free(line);
  }
  CVar2 = create_object(&object->object);
  return CVar2;
}

Assistant:

CrispyValue std_input(CrispyValue *value, Vm *vm) {
    char *line;
    ssize_t length = read_line(&line);

    if (length < 0) {
        vm->err_flag = true;
        return create_object((Object *) new_string(vm, "Error while reading line from stdin", 35));
    }

    // cut off trailing newline
    ObjString *string = new_string(vm, line, (size_t) length - 1);
    free(line);

    return create_object((Object *) string);
}